

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRNetServer.cpp
# Opt level: O2

VRDataQueue * __thiscall
MinVR::VRNetServer::syncEventDataAcrossAllNodes
          (VRDataQueue *__return_storage_ptr__,VRNetServer *this,VRDataQueue *eventQueue)

{
  int iVar1;
  int extraout_EDX;
  uint *puVar2;
  int *piVar3;
  serialData serializedEventQueue;
  serialData local_c0;
  serialData local_a0;
  serialData local_80;
  _Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
  local_60;
  
  iVar1 = (int)eventQueue;
  for (puVar2 = (uint *)(this->_clientSocketFDs).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
      puVar2 < (this->_clientSocketFDs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
    VRNetInterface::waitForAndReceiveEventData_abi_cxx11_
              (&local_c0,(VRNetInterface *)(ulong)*puVar2,iVar1);
    std::__cxx11::string::string((string *)&local_80,(string *)&local_c0);
    VRDataQueue::VRDataQueue((VRDataQueue *)&local_60,&local_80);
    VRDataQueue::addQueue(eventQueue,(VRDataQueue *)&local_60);
    std::
    _Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
    ::~_Rb_tree(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_c0);
    iVar1 = extraout_EDX;
  }
  VRDataQueue::serialize_abi_cxx11_(&local_c0,eventQueue);
  for (piVar3 = (this->_clientSocketFDs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar3 < (this->_clientSocketFDs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish; piVar3 = piVar3 + 1) {
    iVar1 = *piVar3;
    std::__cxx11::string::string((string *)&local_a0,(string *)&local_c0);
    VRNetInterface::sendEventData(iVar1,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  std::_Rb_tree_header::_Rb_tree_header
            (&(__return_storage_ptr__->_dataMap)._M_t._M_impl.super__Rb_tree_header,
             &(eventQueue->_dataMap)._M_t._M_impl.super__Rb_tree_header);
  std::__cxx11::string::~string((string *)&local_c0);
  return __return_storage_ptr__;
}

Assistant:

VRDataQueue VRNetServer::syncEventDataAcrossAllNodes(VRDataQueue eventQueue) {

  // TODO: rather than a for loop, could use a select() system call
  // here (I think) to figure out which socket is ready for a read in
  // the situation where one client is ready but other(s) are not
  for (std::vector<SOCKET>::iterator itr=_clientSocketFDs.begin();
       itr < _clientSocketFDs.end(); itr++) {
    VRDataQueue::serialData eventData = waitForAndReceiveEventData(*itr);

    eventQueue.addQueue(eventData);
  }

  VRDataQueue::serialData serializedEventQueue = eventQueue.serialize();
  // 2. send new combined inputEvents array out to all clients
  for (std::vector<SOCKET>::iterator itr=_clientSocketFDs.begin();
       itr < _clientSocketFDs.end(); itr++) {
    sendEventData(*itr, serializedEventQueue);
  }

  return eventQueue;
}